

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagLongLong8Array
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,
              uint64_t *value)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint local_84;
  uint64_t *puStack_80;
  uint32_t mb_1;
  uint64_t *ma_1;
  uint16_t *q_1;
  uint16_t *p_1;
  uint64_t *puStack_60;
  uint32_t mb;
  uint64_t *ma;
  uint32_t *q;
  uint32_t *p;
  int local_40;
  int write_aslong8;
  int write_aslong4;
  int o;
  uint64_t *value_local;
  uint32_t count_local;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else if ((tif->tif_dir).td_deferstrilearraywriting == '\0') {
    if ((tif->tif_flags & 0x80000) != 0) {
      p._4_4_ = 1;
      if ((count < 2) || (tag != 0x117)) {
        if ((1 < count) && (tag == 0x145)) {
          uVar2 = TIFFTileSize64(tif);
          p._4_4_ = WriteAsLong8(tif,uVar2);
        }
      }
      else {
        uVar2 = TIFFStripSize64(tif);
        p._4_4_ = WriteAsLong8(tif,uVar2);
      }
      if (p._4_4_ != 0) {
        iVar1 = TIFFWriteDirectoryTagCheckedLong8Array(tif,ndir,dir,tag,count,value);
        return iVar1;
      }
    }
    local_40 = 1;
    if ((count < 2) || (tag != 0x117)) {
      if ((1 < count) && (tag == 0x145)) {
        uVar2 = TIFFTileSize64(tif);
        local_40 = WriteAsLong4(tif,uVar2);
      }
    }
    else {
      uVar2 = TIFFStripSize64(tif);
      local_40 = WriteAsLong4(tif,uVar2);
    }
    if (local_40 == 0) {
      puVar3 = (uint64_t *)_TIFFmallocExt(tif,(ulong)count << 1);
      if (puVar3 == (uint64_t *)0x0) {
        TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array","Out of memory");
        return 0;
      }
      puStack_80 = value;
      ma_1 = puVar3;
      for (local_84 = 0; local_84 < count; local_84 = local_84 + 1) {
        if (0xffff < *puStack_80) {
          TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array",
                        "Attempt to write value larger than 0xFFFF in SHORT array.");
          _TIFFfreeExt(tif,puVar3);
          return 0;
        }
        *(short *)ma_1 = (short)*puStack_80;
        puStack_80 = puStack_80 + 1;
        ma_1 = (uint64_t *)((long)ma_1 + 2);
      }
      write_aslong8 =
           TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,(uint16_t *)puVar3);
      _TIFFfreeExt(tif,puVar3);
    }
    else {
      puVar3 = (uint64_t *)_TIFFmallocExt(tif,(ulong)count << 2);
      if (puVar3 == (uint64_t *)0x0) {
        TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array","Out of memory");
        return 0;
      }
      puStack_60 = value;
      ma = puVar3;
      for (p_1._4_4_ = 0; p_1._4_4_ < count; p_1._4_4_ = p_1._4_4_ + 1) {
        if (0xffffffff < *puStack_60) {
          TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array",
                        "Attempt to write value larger than 0xFFFFFFFF in LONG array.");
          _TIFFfreeExt(tif,puVar3);
          return 0;
        }
        *(int *)ma = (int)*puStack_60;
        puStack_60 = puStack_60 + 1;
        ma = (uint64_t *)((long)ma + 4);
      }
      write_aslong8 =
           TIFFWriteDirectoryTagCheckedLongArray(tif,ndir,dir,tag,count,(uint32_t *)puVar3);
      _TIFFfreeExt(tif,puVar3);
    }
    tif_local._4_4_ = write_aslong8;
  }
  else {
    tif_local._4_4_ = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,0,0,0,(void *)0x0);
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagLongLong8Array(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint32_t count, uint64_t *value)
{
    static const char module[] = "TIFFWriteDirectoryTagLongLong8Array";
    int o;
    int write_aslong4;

    /* is this just a counting pass? */
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }

    if (tif->tif_dir.td_deferstrilearraywriting)
    {
        return TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_NOTYPE, 0, 0,
                                         NULL);
    }

    if (tif->tif_flags & TIFF_BIGTIFF)
    {
        int write_aslong8 = 1;
        /* In the case of ByteCounts array, we may be able to write them on */
        /* LONG if the strip/tilesize is not too big. */
        /* Also do that for count > 1 in the case someone would want to create
         */
        /* a single-strip file with a growing height, in which case using */
        /* LONG8 will be safer. */
        if (count > 1 && tag == TIFFTAG_STRIPBYTECOUNTS)
        {
            write_aslong8 = WriteAsLong8(tif, TIFFStripSize64(tif));
        }
        else if (count > 1 && tag == TIFFTAG_TILEBYTECOUNTS)
        {
            write_aslong8 = WriteAsLong8(tif, TIFFTileSize64(tif));
        }
        if (write_aslong8)
        {
            return TIFFWriteDirectoryTagCheckedLong8Array(tif, ndir, dir, tag,
                                                          count, value);
        }
    }

    write_aslong4 = 1;
    if (count > 1 && tag == TIFFTAG_STRIPBYTECOUNTS)
    {
        write_aslong4 = WriteAsLong4(tif, TIFFStripSize64(tif));
    }
    else if (count > 1 && tag == TIFFTAG_TILEBYTECOUNTS)
    {
        write_aslong4 = WriteAsLong4(tif, TIFFTileSize64(tif));
    }
    if (write_aslong4)
    {
        /*
        ** For classic tiff we want to verify everything is in range for LONG
        ** and convert to long format.
        */

        uint32_t *p = _TIFFmallocExt(tif, count * sizeof(uint32_t));
        uint32_t *q;
        uint64_t *ma;
        uint32_t mb;

        if (p == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }

        for (q = p, ma = value, mb = 0; mb < count; ma++, mb++, q++)
        {
            if (*ma > 0xFFFFFFFF)
            {
                TIFFErrorExtR(tif, module,
                              "Attempt to write value larger than 0xFFFFFFFF "
                              "in LONG array.");
                _TIFFfreeExt(tif, p);
                return (0);
            }
            *q = (uint32_t)(*ma);
        }

        o = TIFFWriteDirectoryTagCheckedLongArray(tif, ndir, dir, tag, count,
                                                  p);
        _TIFFfreeExt(tif, p);
    }
    else
    {
        uint16_t *p = _TIFFmallocExt(tif, count * sizeof(uint16_t));
        uint16_t *q;
        uint64_t *ma;
        uint32_t mb;

        if (p == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }

        for (q = p, ma = value, mb = 0; mb < count; ma++, mb++, q++)
        {
            if (*ma > 0xFFFF)
            {
                /* Should not happen normally given the check we did before */
                TIFFErrorExtR(tif, module,
                              "Attempt to write value larger than 0xFFFF in "
                              "SHORT array.");
                _TIFFfreeExt(tif, p);
                return (0);
            }
            *q = (uint16_t)(*ma);
        }

        o = TIFFWriteDirectoryTagCheckedShortArray(tif, ndir, dir, tag, count,
                                                   p);
        _TIFFfreeExt(tif, p);
    }

    return (o);
}